

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void applyNumericAffinity(Mem *pRec,int bTryForInt)

{
  u8 enc;
  undefined2 uVar1;
  undefined2 uVar2;
  char *z;
  double dVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long in_FS_OFFSET;
  double rValue;
  double local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = -NAN;
  z = pRec->z;
  iVar6 = pRec->n;
  enc = pRec->enc;
  iVar5 = sqlite3AtoF(z,&local_38,iVar6,enc);
  dVar3 = local_38;
  if (iVar5 < 1) goto LAB_001271e1;
  if (iVar5 == 1) {
    lVar7 = 0x7fffffffffffffff;
    if (-9.223372036854775e+18 <= local_38) {
      if (local_38 <= 9.223372036854775e+18) {
        lVar7 = (long)local_38;
      }
    }
    else {
      lVar7 = -0x8000000000000000;
    }
    if (((local_38 == 0.0) && (!NAN(local_38))) ||
       ((0xffe < (uint)((ulong)(lVar7 + -0x8000000000000) >> 0x34) && (local_38 == (double)lVar7))))
    {
      (pRec->u).i = lVar7;
    }
    else {
      iVar6 = sqlite3Atoi64(z,(i64 *)pRec,iVar6,enc);
      if (iVar6 != 0) goto LAB_001271ba;
    }
    uVar1 = pRec->flags;
    uVar4 = uVar1 | 4;
  }
  else {
LAB_001271ba:
    (pRec->u).r = dVar3;
    uVar2 = pRec->flags;
    uVar4 = uVar2 | 8;
    pRec->flags = uVar4;
    if (bTryForInt != 0) {
      sqlite3VdbeIntegerAffinity(pRec);
      uVar4 = pRec->flags;
    }
  }
  pRec->flags = uVar4 & 0xfffd;
LAB_001271e1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void applyNumericAffinity(Mem *pRec, int bTryForInt){
  double rValue;
  u8 enc = pRec->enc;
  int rc;
  assert( (pRec->flags & (MEM_Str|MEM_Int|MEM_Real|MEM_IntReal))==MEM_Str );
  rc = sqlite3AtoF(pRec->z, &rValue, pRec->n, enc);
  if( rc<=0 ) return;
  if( rc==1 && alsoAnInt(pRec, rValue, &pRec->u.i) ){
    pRec->flags |= MEM_Int;
  }else{
    pRec->u.r = rValue;
    pRec->flags |= MEM_Real;
    if( bTryForInt ) sqlite3VdbeIntegerAffinity(pRec);
  }
  /* TEXT->NUMERIC is many->one.  Hence, it is important to invalidate the
  ** string representation after computing a numeric equivalent, because the
  ** string representation might not be the canonical representation for the
  ** numeric value.  Ticket [343634942dd54ab57b7024] 2018-01-31. */
  pRec->flags &= ~MEM_Str;
}